

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::vector_bool::test_method(vector_bool *this)

{
  readonly_property65 rVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  initializer_list<bool> __l_00;
  const_string file;
  _Bit_iterator __first;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  _Bit_iterator __last;
  check_type cVar4;
  char *local_220;
  char *local_218;
  lazy_ostream local_210;
  undefined1 *local_200;
  char **local_1f8;
  assertion_result local_1f0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec1;
  vector<bool,_std::allocator<bool>_> vec2;
  undefined1 local_148 [16];
  shared_count sStack_138;
  uint32_t auStack_130 [2];
  uchar local_128 [80];
  undefined1 local_d8 [32];
  undefined1 local_b8 [9];
  undefined2 uStack_af;
  undefined5 uStack_ad;
  undefined3 uStack_a8;
  uint32_t uStack_a5;
  undefined3 uStack_a0;
  uint32_t uStack_9d;
  uchar local_98 [72];
  base_blob<256U> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_a8 = 0x10000;
  _uStack_a5 = 0x100010101;
  uStack_a0 = 0x10000;
  local_b8._0_8_ = (_func_int **)0x10101000001;
  local_b8[8] = false;
  uStack_af = 0x100;
  uStack_ad = 0x1010000;
  __l._M_len = 0x1b;
  __l._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&vec1,__l,(allocator_type *)local_148);
  uStack_a8 = 0x10000;
  _uStack_a5 = 0x100010101;
  uStack_a0 = 0x10000;
  local_b8._0_8_ = (_func_int **)0x10101000001;
  local_b8[8] = false;
  uStack_af = 0x100;
  uStack_ad = 0x1010000;
  __l_00._M_len = 0x1b;
  __l_00._M_array = (iterator)local_b8;
  std::vector<bool,_std::allocator<bool>_>::vector(&vec2,__l_00,(allocator_type *)local_148);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xc0;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       vec2.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       vec2.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._M_offset =
       vec2.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_offset;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<std::_Bit_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,__first,__last,
             (allocator_type *)&local_210);
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==(&vec1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  local_148[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_148._8_8_ = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_d8._0_8_ = "vec1 == std::vector<uint8_t>(vec2.begin(), vec2.end())";
  local_d8._8_8_ = "";
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_011481f0;
  uStack_a8 = 0x15c140;
  _uStack_a5 = 1;
  uStack_a0 = SUB83(local_d8,0);
  _uStack_9d = (undefined5)((ulong)local_d8 >> 0x18);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_b8,1,0,WARN,_cVar4,
             (size_t)&local_1b8,0xc0);
  boost::detail::shared_count::~shared_count(&sStack_138);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xc1;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_98[0x30] = '\0';
  local_98[0x31] = '\0';
  local_98[0x32] = '\0';
  local_98[0x33] = '\0';
  local_98[0x34] = '\0';
  local_98[0x35] = '\0';
  local_98[0x36] = '\0';
  local_98[0x37] = '\0';
  local_98[0x38] = '\0';
  local_98[0x39] = '\0';
  local_98[0x3a] = '\0';
  local_98[0x3b] = '\0';
  local_98[0x3c] = '\0';
  local_98[0x3d] = '\0';
  local_98[0x3e] = '\0';
  local_98[0x3f] = '\0';
  local_98[0x20] = '\0';
  local_98[0x21] = '\0';
  local_98[0x22] = '\0';
  local_98[0x23] = '\0';
  local_98[0x24] = '\0';
  local_98[0x25] = '\0';
  local_98[0x26] = '\0';
  local_98[0x27] = '\0';
  local_98[0x28] = '\0';
  local_98[0x29] = '\0';
  local_98[0x2a] = '\0';
  local_98[0x2b] = '\0';
  local_98[0x2c] = '\0';
  local_98[0x2d] = '\0';
  local_98[0x2e] = '\0';
  local_98[0x2f] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  local_98[0x18] = '\0';
  local_98[0x19] = '\0';
  local_98[0x1a] = '\0';
  local_98[0x1b] = '\0';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  uStack_a8 = 0;
  _uStack_a5 = 0;
  uStack_a0 = 0;
  _uStack_9d = 0;
  local_b8._0_8_ = (_func_int **)0x0;
  local_b8[8] = false;
  uStack_af = 0;
  uStack_ad = 0;
  local_98[0x40] = '\0';
  local_98[0x41] = '\0';
  local_98[0x42] = '\0';
  local_98[0x43] = '\0';
  local_98[0x44] = '\0';
  local_98[0x45] = '\0';
  local_98[0x46] = '\0';
  local_98[0x47] = '\0';
  CSHA256::CSHA256((CSHA256 *)local_b8);
  Serialize<HashWriter,unsigned_char,std::allocator<unsigned_char>>((HashWriter *)local_b8,&vec1);
  HashWriter::GetHash((uint256 *)&local_50,(HashWriter *)local_b8);
  local_128[0x30] = '\0';
  local_128[0x31] = '\0';
  local_128[0x32] = '\0';
  local_128[0x33] = '\0';
  local_128[0x34] = '\0';
  local_128[0x35] = '\0';
  local_128[0x36] = '\0';
  local_128[0x37] = '\0';
  local_128[0x38] = '\0';
  local_128[0x39] = '\0';
  local_128[0x3a] = '\0';
  local_128[0x3b] = '\0';
  local_128[0x3c] = '\0';
  local_128[0x3d] = '\0';
  local_128[0x3e] = '\0';
  local_128[0x3f] = '\0';
  local_128[0x20] = '\0';
  local_128[0x21] = '\0';
  local_128[0x22] = '\0';
  local_128[0x23] = '\0';
  local_128[0x24] = '\0';
  local_128[0x25] = '\0';
  local_128[0x26] = '\0';
  local_128[0x27] = '\0';
  local_128[0x28] = '\0';
  local_128[0x29] = '\0';
  local_128[0x2a] = '\0';
  local_128[0x2b] = '\0';
  local_128[0x2c] = '\0';
  local_128[0x2d] = '\0';
  local_128[0x2e] = '\0';
  local_128[0x2f] = '\0';
  local_128[0x10] = '\0';
  local_128[0x11] = '\0';
  local_128[0x12] = '\0';
  local_128[0x13] = '\0';
  local_128[0x14] = '\0';
  local_128[0x15] = '\0';
  local_128[0x16] = '\0';
  local_128[0x17] = '\0';
  local_128[0x18] = '\0';
  local_128[0x19] = '\0';
  local_128[0x1a] = '\0';
  local_128[0x1b] = '\0';
  local_128[0x1c] = '\0';
  local_128[0x1d] = '\0';
  local_128[0x1e] = '\0';
  local_128[0x1f] = '\0';
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = '\0';
  local_128[7] = '\0';
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = '\0';
  local_128[0xb] = '\0';
  local_128[0xc] = '\0';
  local_128[0xd] = '\0';
  local_128[0xe] = '\0';
  local_128[0xf] = '\0';
  sStack_138.pi_ = (sp_counted_base *)0x0;
  auStack_130[0] = 0;
  auStack_130[1] = 0;
  local_148._0_8_ = 0;
  local_148._8_8_ = (element_type *)0x0;
  local_128[0x40] = '\0';
  local_128[0x41] = '\0';
  local_128[0x42] = '\0';
  local_128[0x43] = '\0';
  local_128[0x44] = '\0';
  local_128[0x45] = '\0';
  local_128[0x46] = '\0';
  local_128[0x47] = '\0';
  CSHA256::CSHA256((CSHA256 *)local_148);
  Serialize<HashWriter,bool,std::allocator<bool>>((HashWriter *)local_148,&vec2);
  HashWriter::GetHash((uint256 *)local_d8,(HashWriter *)local_148);
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==(&local_50,(base_blob<256U> *)local_d8);
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8 = &local_220;
  local_220 = "(HashWriter{} << vec1).GetHash() == (HashWriter{} << vec2).GetHash()";
  local_218 = "";
  local_210.m_empty = false;
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_200 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_210,1,0,WARN,0xc1b930,(size_t)&stack0xfffffffffffffdd0,0xc1);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&vec2.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vec1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(vector_bool)
{
    std::vector<uint8_t> vec1{1, 0, 0, 1, 1, 1, 0, 0, 0, 0, 1, 0, 0, 1, 1, 0, 0, 0, 1, 1, 1, 1, 0, 1, 0, 0, 1};
    std::vector<bool> vec2{1, 0, 0, 1, 1, 1, 0, 0, 0, 0, 1, 0, 0, 1, 1, 0, 0, 0, 1, 1, 1, 1, 0, 1, 0, 0, 1};

    BOOST_CHECK(vec1 == std::vector<uint8_t>(vec2.begin(), vec2.end()));
    BOOST_CHECK((HashWriter{} << vec1).GetHash() == (HashWriter{} << vec2).GetHash());
}